

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatting.h
# Opt level: O0

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
booster::locale::ios_info::string_set::get<wchar_t>(string_set *this)

{
  bool bVar1;
  undefined8 uVar2;
  long *in_RSI;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_RDI;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *result;
  type_info *in_stack_ffffffffffffffa8;
  wchar_t *pwVar3;
  bad_cast *in_stack_ffffffffffffffb0;
  allocator *paVar4;
  allocator local_12;
  undefined1 local_11;
  
  if ((*in_RSI != 0) &&
     (bVar1 = std::type_info::operator!=
                        ((type_info *)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8), !bVar1))
  {
    local_11 = 0;
    pwVar3 = (wchar_t *)in_RSI[2];
    paVar4 = &local_12;
    std::allocator<wchar_t>::allocator();
    std::__cxx11::wstring::wstring((wstring *)in_RDI,pwVar3,paVar4);
    std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)&local_12);
    return in_RDI;
  }
  uVar2 = __cxa_allocate_exception(8);
  std::bad_cast::bad_cast(in_stack_ffffffffffffffb0);
  __cxa_throw(uVar2,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

std::basic_string<Char> get() const
                {
                    if(type==0 || *type!=typeid(Char))
                        throw std::bad_cast();
                    std::basic_string<Char> result = reinterpret_cast<Char const *>(ptr);
                    return result;
                }